

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forward_int8_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined4 uVar5;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  int *piVar39;
  _func_int *p_Var40;
  Layer *pLVar41;
  undefined1 auVar42 [14];
  undefined1 auVar43 [12];
  unkbyte10 Var44;
  undefined1 auVar45 [14];
  undefined1 auVar46 [12];
  unkbyte10 Var47;
  undefined1 auVar48 [14];
  undefined1 auVar49 [12];
  unkbyte10 Var50;
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [14];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [14];
  undefined1 auVar59 [12];
  undefined1 auVar60 [14];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  unkbyte10 Var63;
  int iVar64;
  int iVar65;
  int iVar66;
  int i;
  int iVar67;
  ulong uVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  undefined1 *puVar72;
  int outw;
  undefined1 *puVar73;
  long lVar74;
  uint uVar75;
  uint uVar76;
  int iVar77;
  void *pvVar78;
  undefined8 *puVar79;
  long lVar80;
  ulong uVar81;
  int i_1;
  uint uVar82;
  int i_3;
  int iVar83;
  undefined8 *puVar84;
  undefined1 *puVar85;
  int iVar86;
  uint uVar87;
  ulong uVar88;
  int iVar89;
  int outw_1;
  undefined1 *puVar90;
  void *pvVar91;
  ulong uVar92;
  bool bVar93;
  char cVar102;
  char cVar103;
  char cVar104;
  char cVar105;
  char cVar106;
  char cVar107;
  undefined1 auVar94 [16];
  int iVar108;
  int iVar119;
  int iVar120;
  int iVar121;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar118 [16];
  int iVar122;
  short sVar135;
  undefined1 auVar123 [12];
  int iVar134;
  int iVar136;
  int iVar137;
  undefined1 auVar124 [16];
  undefined1 auVar132 [16];
  int iVar139;
  int iVar140;
  undefined1 auVar138 [16];
  int iVar141;
  undefined4 uVar142;
  short sVar148;
  undefined1 auVar155 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  short sVar182;
  int iVar179;
  short sVar183;
  short sVar184;
  short sVar185;
  short sVar186;
  short sVar187;
  int iVar188;
  short sVar191;
  short sVar194;
  undefined1 auVar192 [12];
  short sVar197;
  undefined1 auVar195 [12];
  int w_1;
  int w_2;
  int w;
  Option opt_q;
  void *local_208;
  allocator_type local_1f9;
  void *local_1f8;
  void *local_1f0;
  void *local_1e8;
  Mat *local_1e0;
  void *local_1d8;
  void *local_1d0;
  Convolution_x86 *local_1c8;
  undefined1 *local_1c0;
  Option *local_1b8;
  Mat *local_1b0;
  ulong local_1a8;
  Mat *local_1a0;
  Mat local_198;
  Mat local_148;
  Mat local_f8;
  ulong local_b0;
  undefined1 *local_a8;
  Mat *local_a0;
  void *local_98;
  int local_8c;
  undefined1 local_88 [56];
  int local_50;
  size_t local_48;
  long local_40;
  void *local_38;
  undefined7 uVar8;
  undefined7 uVar9;
  undefined6 uVar12;
  undefined6 uVar13;
  undefined5 uVar16;
  undefined5 uVar17;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined3 uVar27;
  undefined3 uVar28;
  undefined3 uVar29;
  undefined2 uVar33;
  undefined2 uVar34;
  undefined2 uVar35;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined6 uVar143;
  undefined8 uVar144;
  undefined1 auVar145 [12];
  undefined1 auVar146 [14];
  undefined1 auVar147 [16];
  undefined4 uVar149;
  undefined6 uVar150;
  undefined8 uVar151;
  undefined1 auVar152 [12];
  undefined1 auVar153 [14];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [12];
  undefined1 auVar181 [16];
  undefined1 auVar189 [12];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar196 [16];
  
  local_88._24_4_ = bottom_blob->elempack;
  if (local_88._24_4_ == 0) {
    bVar93 = false;
  }
  else {
    bVar93 = ((int)bottom_blob->elemsize << 3) / (int)local_88._24_4_ == 8;
  }
  local_88._0_8_ = bottom_blob->data;
  piVar39 = bottom_blob->refcount;
  local_88._8_4_ = SUB84(piVar39,0);
  local_88._12_4_ = (undefined4)((ulong)piVar39 >> 0x20);
  local_88._16_8_ = bottom_blob->elemsize;
  local_88._32_8_ = bottom_blob->allocator;
  local_88._40_4_ = bottom_blob->dims;
  local_88._44_4_ = bottom_blob->w;
  local_88._48_4_ = bottom_blob->h;
  local_88._52_4_ = bottom_blob->d;
  local_50 = bottom_blob->c;
  local_48 = bottom_blob->cstep;
  if (piVar39 != (int *)0x0) {
    LOCK();
    *piVar39 = *piVar39 + 1;
    UNLOCK();
  }
  local_1b8 = opt;
  if (!bVar93) {
    local_198.data = *(void **)opt;
    uVar2 = opt->workspace_allocator;
    uVar5 = opt->openmp_blocktime;
    uVar18 = opt->use_winograd_convolution;
    uVar24 = opt->use_sgemm_convolution;
    uVar30 = opt->use_int8_inference;
    uVar36 = opt->use_vulkan_compute;
    uVar33 = CONCAT11(uVar36,uVar30);
    uVar27 = CONCAT21(uVar33,uVar24);
    uVar21 = CONCAT31(uVar27,uVar18);
    auVar118[0] = opt->use_bf16_storage;
    auVar118[1] = opt->use_fp16_packed;
    auVar118[2] = opt->use_fp16_storage;
    auVar118[3] = opt->use_fp16_arithmetic;
    auVar118[4] = opt->use_int8_packed;
    auVar118[5] = opt->use_int8_storage;
    auVar118[6] = opt->use_int8_arithmetic;
    auVar118[7] = opt->use_packing_layout;
    uVar3 = opt->use_shader_pack8;
    uVar6 = opt->use_subgroup_basic;
    uVar10 = opt->use_subgroup_vote;
    uVar14 = opt->use_subgroup_ballot;
    uVar19 = opt->use_subgroup_shuffle;
    uVar25 = opt->use_image_storage;
    uVar31 = opt->use_tensor_storage;
    uVar37 = opt->use_reserved_0;
    uVar34 = CONCAT11(uVar37,uVar31);
    uVar28 = CONCAT21(uVar34,uVar25);
    uVar22 = CONCAT31(uVar28,uVar19);
    uVar16 = CONCAT41(uVar22,uVar14);
    uVar12 = CONCAT51(uVar16,uVar10);
    uVar8 = CONCAT61(uVar12,uVar6);
    auVar118._8_8_ = CONCAT71(uVar8,uVar3);
    auVar132._0_4_ = opt->flush_denormals;
    auVar132[4] = opt->use_local_pool_allocator;
    auVar132[5] = opt->use_shader_local_memory;
    auVar132[6] = opt->use_cooperative_matrix;
    auVar132[7] = opt->use_winograd23_convolution;
    uVar4 = opt->use_winograd43_convolution;
    uVar7 = opt->use_winograd63_convolution;
    uVar11 = opt->use_a53_a55_optimized_kernel;
    uVar15 = opt->use_reserved_7;
    uVar20 = opt->use_reserved_8;
    uVar26 = opt->use_reserved_9;
    uVar32 = opt->use_reserved_10;
    uVar38 = opt->use_reserved_11;
    uVar35 = CONCAT11(uVar38,uVar32);
    uVar29 = CONCAT21(uVar35,uVar26);
    uVar23 = CONCAT31(uVar29,uVar20);
    uVar17 = CONCAT41(uVar23,uVar15);
    uVar13 = CONCAT51(uVar17,uVar11);
    uVar9 = CONCAT61(uVar13,uVar7);
    auVar132._8_8_ = CONCAT71(uVar9,uVar4);
    local_198._48_8_ = auVar132._0_8_;
    local_198.c = (int)auVar132._8_8_;
    local_198.allocator = auVar118._0_8_;
    local_198.dims = (int)auVar118._8_8_;
    local_198.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_198.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_198.elemsize = uVar2;
    local_198.elempack = uVar5;
    local_198._28_4_ = uVar21;
    local_198.w = uVar22;
    local_198._60_4_ = uVar23;
    quantize_to_int8(bottom_blob,(Mat *)local_88,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86[-3]),
                     (Option *)&local_198);
  }
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  local_1c8 = this;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]),
             (Mat *)local_88,&local_148,local_1b8);
  iVar71 = -100;
  if ((local_148.data == (void *)0x0) || ((long)local_148.c * local_148.cstep == 0))
  goto LAB_001b550f;
  p_Var40 = local_1c8->_vptr_Convolution_x86[-3];
  iVar89 = (~((*(int *)(p_Var40 + 0x2c + (long)&(local_1c8->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data)) +
           local_148.w) / *(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data)
           + 1;
  iVar86 = (~((*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data)) +
           local_148.h) / *(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data)
           + 1;
  local_8c = *(int *)(p_Var40 + 0x18 + (long)&(local_1c8->weight_winograd43_data).data);
  uVar82 = 1;
  if (local_1b8->use_packing_layout == true) {
    if (local_8c < 0x65) {
      uVar82 = (uint)((*(uint *)(p_Var40 + 0x28 + (long)&(local_1c8->weight_winograd23_data).data) &
                      3) == 0) * 3 + 1;
    }
    else {
      uVar82 = 1;
      if ((*(uint *)(p_Var40 + 0x28 + (long)&(local_1c8->weight_winograd23_data).data) & 7) == 0) {
        uVar82 = 8;
      }
    }
  }
  local_1a0 = (Mat *)CONCAT44(local_1a0._4_4_,local_148.elempack);
  local_98 = (void *)CONCAT44(local_98._4_4_,local_148.c);
  uVar76 = uVar82 * 4;
  if (100 < local_8c) {
    uVar76 = uVar82;
  }
  Mat::create(top_blob,iVar89,iVar86,
              *(int *)(p_Var40 + 0x28 + (long)&(local_1c8->weight_winograd23_data).data) /
              (int)uVar82,(ulong)uVar76,uVar82,local_1b8->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_001b550f;
  local_b0 = 1;
  if (local_1b8->use_packing_layout == true) {
    local_b0 = (ulong)((uint)(((byte)(local_1c8->_vptr_Convolution_x86[-3] + 0x28)
                                     [(long)&(local_1c8->weight_winograd23_data).data] & 3) == 0) *
                       3 + 1);
  }
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  iVar71 = (int)local_b0;
  local_a0 = top_blob;
  Mat::create(&local_f8,iVar89,iVar86,
              *(int *)(local_1c8->_vptr_Convolution_x86[-3] + 0x28 +
                      (long)&(local_1c8->weight_winograd23_data).data) / iVar71,
              (ulong)(uint)(iVar71 * 4),iVar71,local_1b8->workspace_allocator);
  iVar67 = local_f8.h;
  iVar89 = local_f8.w;
  iVar86 = local_148.c;
  iVar71 = -100;
  if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
    if (((int)local_1a0 == 8) && ((int)local_b0 == 4)) {
      p_Var40 = local_1c8->_vptr_Convolution_x86[-3];
      uVar82 = *(uint *)(p_Var40 + 0x2c + (long)&(local_1c8->weight_winograd23_data).data);
      if ((ulong)uVar82 == 1) {
        if ((((*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 1) &&
             (*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)))) {
          conv1x1s1_sgemm_pack8to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
        else {
          if ((((uVar82 != 1) ||
               ((*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
                (*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) != 1))))
              || (*(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) != 1))
             || ((*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 2 ||
                 (*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) != 2)))
             ) goto LAB_001b38d8;
          conv1x1s2_sgemm_pack8to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
      }
      else {
LAB_001b38d8:
        if ((((local_1b8->use_winograd_convolution == true) &&
             (((uVar82 == 3 && (local_1b8->use_winograd43_convolution != false)) &&
              (*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 3))))
            && (((*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
                 (*(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1))
                && (*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1)
                ))) &&
           (*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) {
          conv3x3s1_winograd43_pack8to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_winograd43_data,local_1b8);
        }
        else {
          local_1f8 = (void *)(ulong)*(uint *)(p_Var40 + 0x30 +
                                              (long)&(local_1c8->weight_winograd23_data).data);
          local_1c0 = (undefined1 *)
                      (long)*(int *)(p_Var40 + 0x34 +
                                    (long)&(local_1c8->weight_winograd23_data).data);
          iVar71 = *(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data);
          iVar83 = *(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data);
          local_1d8 = (void *)(long)*(int *)(p_Var40 + 0x40 +
                                            (long)&(local_1c8->weight_winograd23_data).data);
          local_1e8 = (void *)CONCAT44(local_1e8._4_4_,local_148.w);
          uVar81 = (ulong)(uint)local_148.c;
          puVar73 = (undefined1 *)(ulong)(uint)local_f8.w;
          pvVar78 = (void *)(ulong)(uint)local_f8.h;
          uVar76 = *(uint *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) *
                   uVar82;
          if (local_1b8->use_sgemm_convolution == true) {
            local_198.cstep = 0;
            local_198.data = (void *)0x0;
            local_198.refcount._0_4_ = 0;
            local_198.refcount._4_4_ = 0;
            local_198.elemsize = 0;
            local_198.elempack = 0;
            local_198.allocator = (Allocator *)0x0;
            local_198.dims = 0;
            local_198.w = 0;
            local_198.h = 0;
            local_198.d = 0;
            local_198.c = 0;
            Mat::create(&local_198,local_f8.h * local_f8.w,uVar76,local_148.c,8,8,
                        local_1b8->workspace_allocator);
            local_1e0 = &local_1c8->weight_sgemm_data;
            if (0 < iVar86) {
              iVar86 = (int)local_1e8 * (int)local_1d8;
              local_1d0 = local_148.data;
              local_1d8 = local_198.data;
              local_1f0 = (void *)((long)local_148.w * (long)iVar71);
              local_208 = (void *)0x0;
              do {
                if (0 < (int)local_1f8) {
                  puVar84 = (undefined8 *)
                            ((long)local_198.data +
                            local_198.cstep * (long)local_208 * local_198.elemsize);
                  local_1e8 = (void *)(local_148.elemsize * (long)local_1f0);
                  lVar74 = 0;
                  do {
                    if (0 < (int)uVar82) {
                      uVar68 = 0;
                      do {
                        if (0 < iVar67) {
                          puVar79 = (undefined8 *)
                                    ((long)local_148.data +
                                    uVar68 * (long)local_1c0 * 8 +
                                    (long)local_1e8 * lVar74 +
                                    local_148.cstep * (long)local_208 * local_148.elemsize);
                          uVar76 = 0;
                          do {
                            puVar85 = puVar73;
                            if (0 < iVar89) {
                              do {
                                *puVar84 = *puVar79;
                                puVar84 = puVar84 + 1;
                                puVar79 = puVar79 + iVar83;
                                uVar87 = (int)puVar85 - 1;
                                puVar85 = (undefined1 *)(ulong)uVar87;
                              } while (uVar87 != 0);
                            }
                            puVar79 = puVar79 + (iVar86 - iVar89 * iVar83);
                            uVar76 = uVar76 + 1;
                          } while (uVar76 != iVar67);
                        }
                        uVar68 = uVar68 + 1;
                      } while (uVar68 != uVar82);
                    }
                    lVar74 = lVar74 + 1;
                  } while ((void *)lVar74 != local_1f8);
                }
                local_208 = (void *)((long)local_208 + 1);
              } while (local_208 != (void *)uVar81);
            }
            im2col_sgemm_pack8to4_int8_sse(&local_198,&local_f8,local_1e0,local_1b8);
            piVar39 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
            if (piVar39 != (int *)0x0) {
              LOCK();
              *piVar39 = *piVar39 + -1;
              UNLOCK();
              if (*piVar39 == 0) {
                if (local_198.allocator == (Allocator *)0x0) {
                  if (local_198.data != (void *)0x0) {
                    free(local_198.data);
                  }
                }
                else {
                  (*(local_198.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_198.cstep = 0;
            local_198.data = (void *)0x0;
            local_198.refcount._0_4_ = 0;
            local_198.refcount._4_4_ = 0;
            local_198.elemsize = 0;
            local_198.elempack = 0;
            local_198.dims = 0;
            local_198.w = 0;
            local_198.h = 0;
            local_198.d = 0;
            local_198.c = 0;
          }
          else {
            local_1e0 = (Mat *)(ulong)(uint)local_f8.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_198,(long)(int)uVar76,&local_1f9)
            ;
            if (0 < (int)local_1f8) {
              iVar77 = 0;
              iVar69 = 0;
              iVar70 = 0;
              do {
                if (0 < (int)uVar82) {
                  lVar74 = 0;
                  do {
                    *(int *)((long)local_198.data + (iVar77 + lVar74) * 4) = iVar69;
                    iVar69 = iVar69 + (int)local_1c0;
                    lVar74 = lVar74 + 1;
                  } while (uVar82 != (uint)lVar74);
                  iVar77 = iVar77 + (uint)lVar74;
                }
                iVar69 = iVar69 + ((int)local_1e8 * iVar71 - (int)local_1c0 * uVar82);
                iVar70 = iVar70 + 1;
              } while (iVar70 != (int)local_1f8);
            }
            if (0 < (int)local_1e0) {
              local_1d0 = (void *)((long)iVar89 * 4);
              local_208 = (void *)0x0;
              do {
                if (0 < iVar67) {
                  local_1f8 = (void *)(local_f8.cstep * (long)local_208 * local_f8.elemsize +
                                      (long)local_f8.data);
                  local_1f0 = (void *)0x0;
                  do {
                    if (0 < iVar89) {
                      local_1e8 = (void *)((long)local_1f0 * (long)local_1d8);
                      puVar85 = (undefined1 *)0x0;
                      do {
                        local_1c0 = puVar85;
                        if (iVar86 < 1) {
                          iVar122 = 0;
                          iVar134 = 0;
                          iVar136 = 0;
                          iVar137 = 0;
                          iVar108 = 0;
                          iVar119 = 0;
                          iVar120 = 0;
                          iVar121 = 0;
                          auVar138 = (undefined1  [16])0x0;
                          iVar71 = 0;
                          iVar77 = 0;
                          iVar69 = 0;
                          iVar70 = 0;
                        }
                        else {
                          pvVar91 = (void *)((local_1c8->weight_data_tm).cstep * (long)local_208 *
                                             (local_1c8->weight_data_tm).elemsize +
                                            (long)(local_1c8->weight_data_tm).data);
                          iVar71 = 0;
                          iVar77 = 0;
                          iVar69 = 0;
                          iVar70 = 0;
                          uVar68 = 0;
                          auVar138 = (undefined1  [16])0x0;
                          iVar108 = 0;
                          iVar119 = 0;
                          iVar120 = 0;
                          iVar121 = 0;
                          iVar122 = 0;
                          iVar134 = 0;
                          iVar136 = 0;
                          iVar137 = 0;
                          do {
                            if (0 < (int)uVar76) {
                              lVar74 = 0;
                              do {
                                uVar88 = *(ulong *)((long)local_148.data +
                                                   (long)*(int *)((long)local_198.data + lVar74) * 8
                                                   + local_148.cstep * local_148.elemsize * uVar68 +
                                                     (long)(iVar83 * 8 * (int)local_1c0) +
                                                     (long)local_148.w * (long)local_1e8 *
                                                     local_148.elemsize);
                                cVar102 = (char)(uVar88 >> 8);
                                cVar103 = (char)(uVar88 >> 0x10);
                                cVar104 = (char)(uVar88 >> 0x18);
                                cVar105 = (char)(uVar88 >> 0x20);
                                cVar106 = (char)(uVar88 >> 0x28);
                                cVar107 = (char)(uVar88 >> 0x30);
                                auVar178._8_6_ = 0;
                                auVar178._0_8_ = uVar88;
                                auVar178[0xe] = (char)(uVar88 >> 0x38);
                                auVar178[0xf] = -((long)uVar88 < 0);
                                auVar177._14_2_ = auVar178._14_2_;
                                auVar177._8_5_ = 0;
                                auVar177._0_8_ = uVar88;
                                auVar177[0xd] = -(cVar107 < '\0');
                                auVar176._13_3_ = auVar177._13_3_;
                                auVar176._8_4_ = 0;
                                auVar176._0_8_ = uVar88;
                                auVar176[0xc] = cVar107;
                                auVar175._12_4_ = auVar176._12_4_;
                                auVar175._8_3_ = 0;
                                auVar175._0_8_ = uVar88;
                                auVar175[0xb] = -(cVar106 < '\0');
                                auVar174._11_5_ = auVar175._11_5_;
                                auVar174._8_2_ = 0;
                                auVar174._0_8_ = uVar88;
                                auVar174[10] = cVar106;
                                auVar173._10_6_ = auVar174._10_6_;
                                auVar173[8] = 0;
                                auVar173._0_8_ = uVar88;
                                auVar173[9] = -(cVar105 < '\0');
                                auVar172._9_7_ = auVar173._9_7_;
                                auVar172[8] = cVar105;
                                auVar172._0_8_ = uVar88;
                                Var44 = CONCAT91(CONCAT81(auVar172._8_8_,-(cVar104 < '\0')),cVar104)
                                ;
                                auVar43._2_10_ = Var44;
                                auVar43[1] = -(cVar103 < '\0');
                                auVar43[0] = cVar103;
                                auVar42._2_12_ = auVar43;
                                auVar42[1] = -(cVar102 < '\0');
                                auVar42[0] = cVar102;
                                auVar171._0_2_ = CONCAT11(-((char)uVar88 < '\0'),(char)uVar88);
                                auVar171._2_14_ = auVar42;
                                auVar118 = *(undefined1 (*) [16])((long)pvVar91 + lVar74 * 8);
                                auVar132 = *(undefined1 (*) [16])((long)pvVar91 + lVar74 * 8 + 0x10)
                                ;
                                auVar169._0_14_ = auVar118._0_14_;
                                auVar169[0xe] = auVar118[7];
                                auVar169[0xf] = -(auVar118[7] < '\0');
                                auVar168._14_2_ = auVar169._14_2_;
                                auVar168._0_13_ = auVar118._0_13_;
                                auVar168[0xd] = -(auVar118[6] < '\0');
                                auVar167._13_3_ = auVar168._13_3_;
                                auVar167._0_12_ = auVar118._0_12_;
                                auVar167[0xc] = auVar118[6];
                                auVar166._12_4_ = auVar167._12_4_;
                                auVar166._0_11_ = auVar118._0_11_;
                                auVar166[0xb] = -(auVar118[5] < '\0');
                                auVar165._11_5_ = auVar166._11_5_;
                                auVar165._0_10_ = auVar118._0_10_;
                                auVar165[10] = auVar118[5];
                                auVar164._10_6_ = auVar165._10_6_;
                                auVar164._0_9_ = auVar118._0_9_;
                                auVar164[9] = -(auVar118[4] < '\0');
                                auVar163._9_7_ = auVar164._9_7_;
                                auVar163._0_8_ = auVar118._0_8_;
                                auVar163[8] = auVar118[4];
                                Var47 = CONCAT91(CONCAT81(auVar163._8_8_,-(auVar118[3] < '\0')),
                                                 auVar118[3]);
                                auVar46._2_10_ = Var47;
                                auVar46[1] = -(auVar118[2] < '\0');
                                auVar46[0] = auVar118[2];
                                auVar45._2_12_ = auVar46;
                                auVar45[1] = -(auVar118[1] < '\0');
                                auVar45[0] = auVar118[1];
                                auVar162._0_2_ = CONCAT11(-(auVar118[0] < '\0'),auVar118[0]);
                                auVar162._2_14_ = auVar45;
                                sVar148 = CONCAT11(-(auVar118[8] < '\0'),auVar118[8]);
                                uVar149 = CONCAT13(-(auVar118[9] < '\0'),
                                                   CONCAT12(auVar118[9],sVar148));
                                uVar150 = CONCAT15(-(auVar118[10] < '\0'),
                                                   CONCAT14(auVar118[10],uVar149));
                                uVar151 = CONCAT17(-(auVar118[0xb] < '\0'),
                                                   CONCAT16(auVar118[0xb],uVar150));
                                auVar152._0_10_ =
                                     CONCAT19(-(auVar118[0xc] < '\0'),
                                              CONCAT18(auVar118[0xc],uVar151));
                                auVar152[10] = auVar118[0xd];
                                auVar152[0xb] = -(auVar118[0xd] < '\0');
                                auVar153[0xc] = auVar118[0xe];
                                auVar153._0_12_ = auVar152;
                                auVar153[0xd] = -(auVar118[0xe] < '\0');
                                auVar154[0xe] = auVar118[0xf];
                                auVar154._0_14_ = auVar153;
                                auVar154[0xf] = -(auVar118[0xf] < '\0');
                                auVar160._0_14_ = auVar132._0_14_;
                                auVar160[0xe] = auVar132[7];
                                auVar160[0xf] = -(auVar132[7] < '\0');
                                auVar159._14_2_ = auVar160._14_2_;
                                auVar159._0_13_ = auVar132._0_13_;
                                auVar159[0xd] = -(auVar132[6] < '\0');
                                auVar158._13_3_ = auVar159._13_3_;
                                auVar158._0_12_ = auVar132._0_12_;
                                auVar158[0xc] = auVar132[6];
                                auVar170._12_4_ = auVar158._12_4_;
                                auVar170._0_11_ = auVar132._0_11_;
                                auVar170[0xb] = -(auVar132[5] < '\0');
                                auVar157._11_5_ = auVar170._11_5_;
                                auVar157._0_10_ = auVar132._0_10_;
                                auVar157[10] = auVar132[5];
                                auVar161._10_6_ = auVar157._10_6_;
                                auVar161._0_9_ = auVar132._0_9_;
                                auVar161[9] = -(auVar132[4] < '\0');
                                auVar156._9_7_ = auVar161._9_7_;
                                auVar156._0_8_ = auVar132._0_8_;
                                auVar156[8] = auVar132[4];
                                Var50 = CONCAT91(CONCAT81(auVar156._8_8_,-(auVar132[3] < '\0')),
                                                 auVar132[3]);
                                auVar49._2_10_ = Var50;
                                auVar49[1] = -(auVar132[2] < '\0');
                                auVar49[0] = auVar132[2];
                                auVar48._2_12_ = auVar49;
                                auVar48[1] = -(auVar132[1] < '\0');
                                auVar48[0] = auVar132[1];
                                auVar155._0_2_ = CONCAT11(-(auVar132[0] < '\0'),auVar132[0]);
                                auVar155._2_14_ = auVar48;
                                sVar135 = CONCAT11(-(auVar132[8] < '\0'),auVar132[8]);
                                uVar142 = CONCAT13(-(auVar132[9] < '\0'),
                                                   CONCAT12(auVar132[9],sVar135));
                                uVar143 = CONCAT15(-(auVar132[10] < '\0'),
                                                   CONCAT14(auVar132[10],uVar142));
                                uVar144 = CONCAT17(-(auVar132[0xb] < '\0'),
                                                   CONCAT16(auVar132[0xb],uVar143));
                                auVar145._0_10_ =
                                     CONCAT19(-(auVar132[0xc] < '\0'),
                                              CONCAT18(auVar132[0xc],uVar144));
                                auVar145[10] = auVar132[0xd];
                                auVar145[0xb] = -(auVar132[0xd] < '\0');
                                auVar146[0xc] = auVar132[0xe];
                                auVar146._0_12_ = auVar145;
                                auVar146[0xd] = -(auVar132[0xe] < '\0');
                                auVar147[0xe] = auVar132[0xf];
                                auVar147._0_14_ = auVar146;
                                auVar147[0xf] = -(auVar132[0xf] < '\0');
                                sVar182 = auVar42._0_2_;
                                sVar183 = auVar43._0_2_;
                                sVar197 = (short)Var44;
                                sVar184 = sVar197 * (short)Var47;
                                sVar185 = auVar172._8_2_;
                                sVar186 = auVar174._10_2_;
                                sVar187 = auVar176._12_2_;
                                auVar170 = pmulhw(auVar162,auVar171);
                                sVar191 = sVar197 * (short)((ulong)uVar151 >> 0x30);
                                auVar132 = pmulhw(auVar154,auVar171);
                                sVar194 = sVar197 * (short)Var50;
                                auVar161 = pmulhw(auVar155,auVar171);
                                sVar197 = sVar197 * (short)((ulong)uVar144 >> 0x30);
                                auVar118 = pmulhw(auVar147,auVar171);
                                iVar188 = CONCAT22(auVar170._6_2_,sVar184);
                                Var44 = CONCAT64(CONCAT42(iVar188,auVar170._4_2_),
                                                 CONCAT22(sVar183 * auVar46._0_2_,sVar184));
                                auVar51._4_8_ = (long)((unkuint10)Var44 >> 0x10);
                                auVar51._2_2_ = auVar170._2_2_;
                                auVar51._0_2_ = sVar182 * auVar45._0_2_;
                                iVar64 = CONCAT22(auVar132._6_2_,sVar191);
                                Var47 = CONCAT64(CONCAT42(iVar64,auVar132._4_2_),
                                                 CONCAT22(sVar183 * (short)((uint6)uVar150 >> 0x20),
                                                          sVar191));
                                auVar52._4_8_ = (long)((unkuint10)Var47 >> 0x10);
                                auVar52._2_2_ = auVar132._2_2_;
                                auVar52._0_2_ = sVar182 * (short)((uint)uVar149 >> 0x10);
                                iVar139 = auVar138._4_4_;
                                iVar140 = auVar138._8_4_;
                                iVar141 = auVar138._12_4_;
                                iVar65 = CONCAT22(auVar161._6_2_,sVar194);
                                Var50 = CONCAT64(CONCAT42(iVar65,auVar161._4_2_),
                                                 CONCAT22(sVar183 * auVar49._0_2_,sVar194));
                                auVar53._4_8_ = (long)((unkuint10)Var50 >> 0x10);
                                auVar53._2_2_ = auVar161._2_2_;
                                auVar53._0_2_ = sVar182 * auVar48._0_2_;
                                iVar66 = CONCAT22(auVar118._6_2_,sVar197);
                                Var63 = CONCAT64(CONCAT42(iVar66,auVar118._4_2_),
                                                 CONCAT22(sVar183 * (short)((uint6)uVar143 >> 0x20),
                                                          sVar197));
                                auVar54._4_8_ = (long)((unkuint10)Var63 >> 0x10);
                                auVar54._2_2_ = auVar118._2_2_;
                                auVar54._0_2_ = sVar182 * (short)((uint)uVar142 >> 0x10);
                                iVar179 = CONCAT22(auVar170._8_2_,sVar185 * auVar163._8_2_);
                                auVar180._0_8_ =
                                     CONCAT26(auVar170._10_2_,
                                              CONCAT24(sVar186 * auVar165._10_2_,iVar179));
                                auVar180._8_2_ = sVar187 * auVar167._12_2_;
                                auVar180._10_2_ = auVar170._12_2_;
                                auVar181._12_2_ = auVar177._14_2_ * auVar168._14_2_;
                                auVar181._0_12_ = auVar180;
                                auVar181._14_2_ = auVar170._14_2_;
                                iVar71 = iVar179 + CONCAT22(auVar170._0_2_,
                                                            auVar171._0_2_ * auVar162._0_2_) +
                                                   iVar71;
                                iVar77 = (int)((ulong)auVar180._0_8_ >> 0x20) +
                                         auVar51._0_4_ + iVar77;
                                iVar69 = auVar180._8_4_ + (int)((unkuint10)Var44 >> 0x10) + iVar69;
                                iVar70 = auVar181._12_4_ + iVar188 + iVar70;
                                iVar188 = CONCAT22(auVar132._8_2_,
                                                   sVar185 * (short)((unkuint10)auVar152._0_10_ >>
                                                                    0x40));
                                auVar189._0_8_ =
                                     CONCAT26(auVar132._10_2_,
                                              CONCAT24(sVar186 * auVar152._10_2_,iVar188));
                                auVar189._8_2_ = sVar187 * auVar153._12_2_;
                                auVar189._10_2_ = auVar132._12_2_;
                                auVar190._12_2_ = auVar177._14_2_ * auVar154._14_2_;
                                auVar190._0_12_ = auVar189;
                                auVar190._14_2_ = auVar132._14_2_;
                                auVar138._0_4_ =
                                     iVar188 + CONCAT22(auVar132._0_2_,auVar171._0_2_ * sVar148) +
                                               auVar138._0_4_;
                                auVar138._4_4_ =
                                     (int)((ulong)auVar189._0_8_ >> 0x20) + auVar52._0_4_ + iVar139;
                                auVar138._8_4_ =
                                     auVar189._8_4_ + (int)((unkuint10)Var47 >> 0x10) + iVar140;
                                auVar138._12_4_ = auVar190._12_4_ + iVar64 + iVar141;
                                iVar188 = CONCAT22(auVar161._8_2_,sVar185 * auVar156._8_2_);
                                auVar192._0_8_ =
                                     CONCAT26(auVar161._10_2_,
                                              CONCAT24(sVar186 * auVar157._10_2_,iVar188));
                                auVar192._8_2_ = sVar187 * auVar158._12_2_;
                                auVar192._10_2_ = auVar161._12_2_;
                                auVar193._12_2_ = auVar177._14_2_ * auVar159._14_2_;
                                auVar193._0_12_ = auVar192;
                                auVar193._14_2_ = auVar161._14_2_;
                                iVar108 = iVar188 + CONCAT22(auVar161._0_2_,
                                                             auVar171._0_2_ * auVar155._0_2_) +
                                                    iVar108;
                                iVar119 = (int)((ulong)auVar192._0_8_ >> 0x20) +
                                          auVar53._0_4_ + iVar119;
                                iVar120 = auVar192._8_4_ + (int)((unkuint10)Var50 >> 0x10) + iVar120
                                ;
                                iVar121 = auVar193._12_4_ + iVar65 + iVar121;
                                iVar188 = CONCAT22(auVar118._8_2_,
                                                   sVar185 * (short)((unkuint10)auVar145._0_10_ >>
                                                                    0x40));
                                auVar195._0_8_ =
                                     CONCAT26(auVar118._10_2_,
                                              CONCAT24(sVar186 * auVar145._10_2_,iVar188));
                                auVar195._8_2_ = sVar187 * auVar146._12_2_;
                                auVar195._10_2_ = auVar118._12_2_;
                                auVar196._12_2_ = auVar177._14_2_ * auVar147._14_2_;
                                auVar196._0_12_ = auVar195;
                                auVar196._14_2_ = auVar118._14_2_;
                                iVar122 = iVar188 + CONCAT22(auVar118._0_2_,auVar171._0_2_ * sVar135
                                                            ) + iVar122;
                                iVar134 = (int)((ulong)auVar195._0_8_ >> 0x20) +
                                          auVar54._0_4_ + iVar134;
                                iVar136 = auVar195._8_4_ + (int)((unkuint10)Var63 >> 0x10) + iVar136
                                ;
                                iVar137 = auVar196._12_4_ + iVar66 + iVar137;
                                lVar74 = lVar74 + 4;
                              } while ((ulong)uVar76 << 2 != lVar74);
                              pvVar91 = (void *)((long)pvVar91 + (ulong)uVar76 * 0x20);
                            }
                            uVar68 = uVar68 + 1;
                          } while (uVar68 != uVar81);
                        }
                        piVar39 = (int *)((long)local_1f8 + (long)local_1c0 * 0x10);
                        *piVar39 = iVar70 + iVar69 + iVar77 + iVar71;
                        piVar39[1] = auVar138._12_4_ + auVar138._8_4_ +
                                     auVar138._4_4_ + auVar138._0_4_;
                        piVar39[2] = iVar121 + iVar120 + iVar119 + iVar108;
                        piVar39[3] = iVar137 + iVar136 + iVar134 + iVar122;
                        puVar85 = local_1c0 + 1;
                      } while (local_1c0 + 1 != puVar73);
                    }
                    local_1f8 = (void *)((long)local_1f8 + (long)iVar89 * 0x10);
                    local_1f0 = (void *)((long)local_1f0 + 1);
                  } while (local_1f0 != pvVar78);
                }
                local_208 = (void *)((long)local_208 + 1);
              } while ((Mat *)local_208 != local_1e0);
            }
            if (local_198.data != (void *)0x0) {
              operator_delete(local_198.data,local_198.elemsize - (long)local_198.data);
            }
          }
        }
      }
    }
    iVar89 = local_f8.h;
    iVar86 = local_f8.w;
    iVar71 = local_148.c;
    if (((int)local_1a0 == 1) && ((int)local_b0 == 4)) {
      p_Var40 = local_1c8->_vptr_Convolution_x86[-3];
      uVar82 = *(uint *)(p_Var40 + 0x2c + (long)&(local_1c8->weight_winograd23_data).data);
      puVar73 = (undefined1 *)(ulong)uVar82;
      if (puVar73 == (undefined1 *)0x1) {
        if ((((*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 1) &&
             (*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)))) {
          conv1x1s1_sgemm_pack1to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
        else {
          if (((uVar82 != 1) ||
              ((*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) != 1))))
             || ((*(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
                 ((*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 2
                  || (*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) !=
                      2)))))) goto LAB_001b4017;
          conv1x1s2_sgemm_pack1to4_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
      }
      else {
LAB_001b4017:
        if (uVar82 == 3) {
          if ((((*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 3) &&
               (*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
             ((*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)))) {
            conv3x3s1_pack1to4_int8_sse
                      (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
          }
          else {
            if ((((*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) != 3)
                 || ((*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) !=
                      1 || (*(int *)(p_Var40 + 0x38 +
                                    (long)&(local_1c8->weight_winograd23_data).data) != 1)))) ||
                (*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 2))
               || (*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) != 2))
            goto LAB_001b40c7;
            conv3x3s2_pack1to4_int8_sse
                      (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
          }
        }
        else {
LAB_001b40c7:
          if ((((uVar82 == 7) &&
               (*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 7)) &&
              (*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
             (((*(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 2)) &&
              (*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 2)))) {
            conv7x7s2_pack1to4_int8_sse
                      (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
          }
          else {
            local_1f0 = (void *)(ulong)*(uint *)(p_Var40 + 0x30 +
                                                (long)&(local_1c8->weight_winograd23_data).data);
            local_1e8 = (void *)(long)*(int *)(p_Var40 + 0x34 +
                                              (long)&(local_1c8->weight_winograd23_data).data);
            local_1a8 = (ulong)*(int *)(p_Var40 + 0x38 +
                                       (long)&(local_1c8->weight_winograd23_data).data);
            iVar67 = *(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data);
            lVar74 = (long)iVar67;
            local_1d8 = (void *)(long)*(int *)(p_Var40 + 0x40 +
                                              (long)&(local_1c8->weight_winograd23_data).data);
            local_1f8 = (void *)CONCAT44(local_1f8._4_4_,local_148.w);
            puVar85 = (undefined1 *)(ulong)(uint)local_148.c;
            puVar90 = (undefined1 *)(long)local_f8.w;
            pvVar78 = (void *)(ulong)(uint)local_f8.h;
            uVar76 = *(uint *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) *
                     uVar82;
            if (local_1b8->use_sgemm_convolution == true) {
              local_198.cstep = 0;
              local_198.data = (void *)0x0;
              local_198.refcount._0_4_ = 0;
              local_198.refcount._4_4_ = 0;
              local_198.elemsize = 0;
              local_198.elempack = 0;
              local_198.allocator = (Allocator *)0x0;
              local_198.dims = 0;
              local_198.w = 0;
              local_198.h = 0;
              local_198.d = 0;
              local_198.c = 0;
              Mat::create(&local_198,local_f8.h * local_f8.w,uVar76,local_148.c,1,1,
                          local_1b8->workspace_allocator);
              local_1b0 = &local_1c8->weight_sgemm_data;
              if (0 < iVar71) {
                iVar71 = (int)local_1f8 * (int)local_1d8;
                local_1e0 = (Mat *)0x0;
                do {
                  if (0 < (int)local_1f0) {
                    local_1d0 = (void *)(local_148.cstep * (long)local_1e0 * local_148.elemsize +
                                        (long)local_148.data);
                    puVar90 = (undefined1 *)
                              (local_198.cstep * (long)local_1e0 * local_198.elemsize +
                              (long)local_198.data);
                    local_1d8 = (void *)((long)local_148.w * local_148.elemsize * local_1a8);
                    pvVar78 = (void *)0x0;
                    do {
                      if (0 < (int)uVar82) {
                        local_1f8 = (void *)((long)local_1d8 * (long)pvVar78 + (long)local_1d0);
                        lVar80 = 0;
                        do {
                          if (0 < iVar89) {
                            puVar72 = (undefined1 *)((long)local_1f8 + lVar80 * (long)local_1e8);
                            uVar76 = 0;
                            do {
                              if (iVar86 < 4) {
                                uVar87 = 0;
                              }
                              else {
                                iVar83 = 3;
                                do {
                                  *puVar90 = *puVar72;
                                  puVar90[1] = puVar72[lVar74];
                                  puVar90[2] = puVar72[iVar67 * 2];
                                  puVar90[3] = puVar72[iVar67 * 3];
                                  puVar72 = puVar72 + lVar74 * 4;
                                  puVar90 = puVar90 + 4;
                                  iVar83 = iVar83 + 4;
                                  uVar87 = iVar86 & 0xfffffffc;
                                } while (iVar83 < iVar86);
                              }
                              uVar75 = uVar87 | 1;
                              while ((int)uVar75 < iVar86) {
                                *puVar90 = *puVar72;
                                puVar90[1] = puVar72[lVar74];
                                puVar72 = puVar72 + iVar67 * 2;
                                puVar90 = puVar90 + 2;
                                uVar75 = uVar87 + 3;
                                uVar87 = uVar87 + 2;
                              }
                              if ((int)uVar87 < iVar86) {
                                iVar83 = iVar86 - uVar87;
                                do {
                                  *puVar90 = *puVar72;
                                  puVar72 = puVar72 + lVar74;
                                  puVar90 = puVar90 + 1;
                                  iVar83 = iVar83 + -1;
                                } while (iVar83 != 0);
                              }
                              puVar72 = puVar72 + (iVar71 - iVar86 * iVar67);
                              uVar76 = uVar76 + 1;
                            } while (uVar76 != iVar89);
                          }
                          lVar80 = lVar80 + 1;
                        } while ((undefined1 *)lVar80 != puVar73);
                      }
                      pvVar78 = (void *)((long)pvVar78 + 1);
                    } while (pvVar78 != local_1f0);
                  }
                  local_1e0 = (Mat *)((long)&local_1e0->data + 1);
                  local_1c0 = puVar73;
                } while (local_1e0 != (Mat *)puVar85);
              }
              im2col_sgemm_pack1to4_int8_sse(&local_198,&local_f8,local_1b0,local_1b8);
              piVar39 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
              if (piVar39 != (int *)0x0) {
                LOCK();
                *piVar39 = *piVar39 + -1;
                UNLOCK();
                if (*piVar39 == 0) {
                  if (local_198.allocator == (Allocator *)0x0) {
                    if (local_198.data != (void *)0x0) {
                      free(local_198.data);
                    }
                  }
                  else {
                    (*(local_198.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_198.cstep = 0;
              local_198.data = (void *)0x0;
              local_198.refcount._0_4_ = 0;
              local_198.refcount._4_4_ = 0;
              local_198.elemsize = 0;
              local_198.elempack = 0;
              local_198.dims = 0;
              local_198.w = 0;
              local_198.h = 0;
              local_198.d = 0;
              local_198.c = 0;
            }
            else {
              local_1e0 = (Mat *)(ulong)(uint)local_f8.c;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_198,(long)(int)uVar76,
                         &local_1f9);
              if (0 < (int)local_1f0) {
                iVar67 = 0;
                iVar83 = 0;
                iVar77 = 0;
                do {
                  if (0 < (int)uVar82) {
                    lVar80 = 0;
                    do {
                      *(int *)((long)local_198.data + (iVar67 + lVar80) * 4) = iVar83;
                      iVar83 = iVar83 + (int)local_1e8;
                      lVar80 = lVar80 + 1;
                    } while (uVar82 != (uint)lVar80);
                    iVar67 = iVar67 + (uint)lVar80;
                  }
                  iVar83 = iVar83 + ((int)local_1f8 * (int)local_1a8 - (int)local_1e8 * uVar82);
                  iVar77 = iVar77 + 1;
                } while (iVar77 != (int)local_1f0);
              }
              if (0 < (int)local_1e0) {
                local_1d0 = (void *)((long)puVar90 * 4);
                local_208 = (void *)0x0;
                do {
                  if (0 < iVar89) {
                    local_1f8 = (void *)(local_f8.cstep * (long)local_208 * local_f8.elemsize +
                                        (long)local_f8.data);
                    local_1f0 = (void *)0x0;
                    do {
                      if (0 < iVar86) {
                        local_1e8 = (void *)((long)local_1f0 * (long)local_1d8);
                        puVar73 = (undefined1 *)0x0;
                        do {
                          local_1c0 = puVar73;
                          if (iVar71 < 1) {
                            iVar67 = 0;
                            iVar83 = 0;
                            iVar77 = 0;
                            iVar69 = 0;
                          }
                          else {
                            pvVar91 = (void *)((local_1c8->weight_data_tm).cstep * (long)local_208 *
                                               (local_1c8->weight_data_tm).elemsize +
                                              (long)(local_1c8->weight_data_tm).data);
                            iVar67 = 0;
                            iVar83 = 0;
                            iVar77 = 0;
                            iVar69 = 0;
                            lVar80 = 0;
                            do {
                              if (0 < (int)uVar76) {
                                uVar81 = 0;
                                do {
                                  auVar118 = ZEXT416((uint)(int)*(char *)((long)local_148.data +
                                                                         (long)*(int *)((long)
                                                  local_198.data + uVar81 * 4) +
                                                  local_148.cstep * local_148.elemsize * lVar80 +
                                                  (long)local_1c0 * lVar74 +
                                                  (long)local_148.w * (long)local_1e8 *
                                                  local_148.elemsize));
                                  auVar118 = pshuflw(auVar118,auVar118,0);
                                  auVar109._0_4_ = auVar118._0_4_;
                                  auVar109._4_4_ = auVar109._0_4_;
                                  auVar109._8_4_ = auVar109._0_4_;
                                  auVar109._12_4_ = auVar109._0_4_;
                                  uVar68 = *(ulong *)((long)pvVar91 + uVar81 * 4);
                                  cVar102 = (char)(uVar68 >> 8);
                                  cVar103 = (char)(uVar68 >> 0x10);
                                  cVar104 = (char)(uVar68 >> 0x18);
                                  cVar105 = (char)(uVar68 >> 0x20);
                                  cVar106 = (char)(uVar68 >> 0x28);
                                  cVar107 = (char)(uVar68 >> 0x30);
                                  auVar131._8_6_ = 0;
                                  auVar131._0_8_ = uVar68;
                                  auVar131[0xe] = (char)(uVar68 >> 0x38);
                                  auVar131[0xf] = -((long)uVar68 < 0);
                                  auVar130._14_2_ = auVar131._14_2_;
                                  auVar130._8_5_ = 0;
                                  auVar130._0_8_ = uVar68;
                                  auVar130[0xd] = -(cVar107 < '\0');
                                  auVar129._13_3_ = auVar130._13_3_;
                                  auVar129._8_4_ = 0;
                                  auVar129._0_8_ = uVar68;
                                  auVar129[0xc] = cVar107;
                                  auVar128._12_4_ = auVar129._12_4_;
                                  auVar128._8_3_ = 0;
                                  auVar128._0_8_ = uVar68;
                                  auVar128[0xb] = -(cVar106 < '\0');
                                  auVar127._11_5_ = auVar128._11_5_;
                                  auVar127._8_2_ = 0;
                                  auVar127._0_8_ = uVar68;
                                  auVar127[10] = cVar106;
                                  auVar126._10_6_ = auVar127._10_6_;
                                  auVar126[8] = 0;
                                  auVar126._0_8_ = uVar68;
                                  auVar126[9] = -(cVar105 < '\0');
                                  auVar125._9_7_ = auVar126._9_7_;
                                  auVar125[8] = cVar105;
                                  auVar125._0_8_ = uVar68;
                                  Var44 = CONCAT91(CONCAT81(auVar125._8_8_,-(cVar104 < '\0')),
                                                   cVar104);
                                  auVar56._2_10_ = Var44;
                                  auVar56[1] = -(cVar103 < '\0');
                                  auVar56[0] = cVar103;
                                  auVar55._2_12_ = auVar56;
                                  auVar55[1] = -(cVar102 < '\0');
                                  auVar55[0] = cVar102;
                                  auVar124._0_2_ = CONCAT11(-((char)uVar68 < '\0'),(char)uVar68);
                                  auVar124._2_14_ = auVar55;
                                  sVar135 = auVar118._2_2_ * (short)Var44;
                                  auVar132 = pmulhw(auVar124,auVar109);
                                  iVar70 = CONCAT22(auVar132._6_2_,sVar135);
                                  Var44 = CONCAT64(CONCAT42(iVar70,auVar132._4_2_),
                                                   CONCAT22(auVar118._0_2_ * auVar56._0_2_,sVar135))
                                  ;
                                  auVar57._4_8_ = (long)((unkuint10)Var44 >> 0x10);
                                  auVar57._2_2_ = auVar132._2_2_;
                                  auVar57._0_2_ = auVar118._2_2_ * auVar55._0_2_;
                                  iVar67 = iVar67 + CONCAT22(auVar132._0_2_,
                                                             auVar118._0_2_ * auVar124._0_2_);
                                  iVar83 = iVar83 + auVar57._0_4_;
                                  iVar77 = iVar77 + (int)((unkuint10)Var44 >> 0x10);
                                  iVar69 = iVar69 + iVar70;
                                  uVar81 = uVar81 + 1;
                                } while (uVar76 != uVar81);
                                pvVar91 = (void *)((long)pvVar91 + (ulong)uVar76 * 4);
                              }
                              lVar80 = lVar80 + 1;
                            } while ((undefined1 *)lVar80 != puVar85);
                          }
                          piVar39 = (int *)((long)local_1f8 + (long)local_1c0 * 0x10);
                          *piVar39 = iVar67;
                          piVar39[1] = iVar83;
                          piVar39[2] = iVar77;
                          piVar39[3] = iVar69;
                          puVar73 = local_1c0 + 1;
                        } while (local_1c0 + 1 != puVar90);
                      }
                      local_1f8 = (void *)((long)local_1f8 + (long)puVar90 * 0x10);
                      local_1f0 = (void *)((long)local_1f0 + 1);
                    } while (local_1f0 != pvVar78);
                  }
                  local_208 = (void *)((long)local_208 + 1);
                } while ((Mat *)local_208 != local_1e0);
              }
              if (local_198.data != (void *)0x0) {
                operator_delete(local_198.data,local_198.elemsize - (long)local_198.data);
              }
            }
          }
        }
      }
    }
    iVar89 = local_f8.w;
    iVar86 = local_148.c;
    iVar71 = local_148.w;
    if (((int)local_1a0 == 8) && ((int)local_b0 == 1)) {
      p_Var40 = local_1c8->_vptr_Convolution_x86[-3];
      uVar82 = *(uint *)(p_Var40 + 0x2c + (long)&(local_1c8->weight_winograd23_data).data);
      if ((ulong)uVar82 == 1) {
        if ((((*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 1) &&
             (*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)))) {
          conv1x1s1_sgemm_pack8to1_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
        else {
          if (((uVar82 != 1) ||
              ((*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) != 1))))
             || ((*(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
                 ((*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 2
                  || (*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) !=
                      2)))))) goto LAB_001b4778;
          conv1x1s2_sgemm_pack8to1_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
      }
      else {
LAB_001b4778:
        if (((local_1b8->use_winograd_convolution == true) &&
            (((((uVar82 == 3 && (local_1b8->use_winograd43_convolution != false)) &&
               (*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 3)) &&
              ((*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1))))
             && (*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1))))
           && (*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) {
          conv3x3s1_winograd43_pack8to1_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_winograd43_data,local_1b8);
        }
        else {
          local_1e8 = (void *)(ulong)*(uint *)(p_Var40 + 0x30 +
                                              (long)&(local_1c8->weight_winograd23_data).data);
          local_1f8 = (void *)(long)*(int *)(p_Var40 + 0x34 +
                                            (long)&(local_1c8->weight_winograd23_data).data);
          iVar67 = *(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data);
          iVar83 = *(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data);
          local_1a8 = (ulong)*(int *)(p_Var40 + 0x40 +
                                     (long)&(local_1c8->weight_winograd23_data).data);
          uVar81 = (ulong)(uint)local_148.c;
          uVar68 = (ulong)(uint)local_f8.w;
          local_1c0 = (undefined1 *)(ulong)(uint)local_f8.h;
          uVar76 = *(uint *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) *
                   uVar82;
          if (local_1b8->use_sgemm_convolution == true) {
            local_198.cstep = 0;
            local_198.data = (void *)0x0;
            local_198.refcount._0_4_ = 0;
            local_198.refcount._4_4_ = 0;
            local_198.elemsize = 0;
            local_198.elempack = 0;
            local_198.allocator = (Allocator *)0x0;
            local_198.dims = 0;
            local_198.w = 0;
            local_198.h = 0;
            local_198.d = 0;
            local_198.c = 0;
            Mat::create(&local_198,local_f8.h * local_f8.w,uVar76,local_148.c,8,8,
                        local_1b8->workspace_allocator);
            local_1e0 = &local_1c8->weight_sgemm_data;
            if (0 < iVar86) {
              local_1d0 = local_148.data;
              local_1d8 = local_198.data;
              local_1f0 = (void *)((long)local_148.w * (long)iVar67);
              local_208 = (void *)0x0;
              do {
                if (0 < (int)local_1e8) {
                  puVar84 = (undefined8 *)
                            ((long)local_198.data +
                            local_198.cstep * (long)local_208 * local_198.elemsize);
                  pvVar78 = (void *)0x0;
                  do {
                    if (0 < (int)uVar82) {
                      uVar88 = 0;
                      do {
                        if (0 < (int)local_1c0) {
                          puVar79 = (undefined8 *)
                                    ((long)local_148.data +
                                    uVar88 * (long)local_1f8 * 8 +
                                    local_148.elemsize * (long)local_1f0 * (long)pvVar78 +
                                    local_148.cstep * (long)local_208 * local_148.elemsize);
                          iVar86 = 0;
                          do {
                            uVar92 = uVar68;
                            if (0 < iVar89) {
                              do {
                                *puVar84 = *puVar79;
                                puVar84 = puVar84 + 1;
                                puVar79 = puVar79 + iVar83;
                                uVar76 = (int)uVar92 - 1;
                                uVar92 = (ulong)uVar76;
                              } while (uVar76 != 0);
                            }
                            puVar79 = puVar79 + (iVar71 * (int)local_1a8 - iVar89 * iVar83);
                            iVar86 = iVar86 + 1;
                          } while (iVar86 != (int)local_1c0);
                        }
                        uVar88 = uVar88 + 1;
                      } while (uVar88 != uVar82);
                    }
                    pvVar78 = (void *)((long)pvVar78 + 1);
                  } while (pvVar78 != local_1e8);
                }
                local_208 = (void *)((long)local_208 + 1);
              } while (local_208 != (void *)uVar81);
            }
            im2col_sgemm_pack8to1_int8_sse(&local_198,&local_f8,local_1e0,local_1b8);
            piVar39 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
            if (piVar39 != (int *)0x0) {
              LOCK();
              *piVar39 = *piVar39 + -1;
              UNLOCK();
              if (*piVar39 == 0) {
                if (local_198.allocator == (Allocator *)0x0) {
                  if (local_198.data != (void *)0x0) {
                    free(local_198.data);
                  }
                }
                else {
                  (*(local_198.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_198.cstep = 0;
            local_198.data = (void *)0x0;
            local_198.refcount._0_4_ = 0;
            local_198.refcount._4_4_ = 0;
            local_198.elemsize = 0;
            local_198.elempack = 0;
            local_198.dims = 0;
            local_198.w = 0;
            local_198.h = 0;
            local_198.d = 0;
            local_198.c = 0;
          }
          else {
            local_a8 = (undefined1 *)(ulong)(uint)local_f8.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_198,(long)(int)uVar76,&local_1f9)
            ;
            if (0 < (int)local_1e8) {
              iVar77 = 0;
              iVar69 = 0;
              iVar70 = 0;
              do {
                if (0 < (int)uVar82) {
                  lVar74 = 0;
                  do {
                    *(int *)((long)local_198.data + (iVar77 + lVar74) * 4) = iVar69;
                    iVar69 = iVar69 + (int)local_1f8;
                    lVar74 = lVar74 + 1;
                  } while (uVar82 != (uint)lVar74);
                  iVar77 = iVar77 + (uint)lVar74;
                }
                iVar69 = iVar69 + (iVar71 * iVar67 - (int)local_1f8 * uVar82);
                iVar70 = iVar70 + 1;
              } while (iVar70 != (int)local_1e8);
            }
            if (0 < (int)local_a8) {
              local_1e0 = (Mat *)(long)iVar89;
              local_38 = local_f8.data;
              local_40 = local_f8.elemsize * local_f8.cstep;
              local_1b0 = (Mat *)0x0;
              do {
                if (0 < (int)local_1c0) {
                  local_1e8 = (void *)(local_40 * (long)local_1b0 + (long)local_f8.data);
                  local_1d0 = (void *)((local_1c8->weight_data_tm).cstep * (long)local_1b0 *
                                       (local_1c8->weight_data_tm).elemsize +
                                      (long)(local_1c8->weight_data_tm).data);
                  local_1d8 = (void *)0x0;
                  do {
                    if (0 < iVar89) {
                      local_1f0 = (void *)((long)local_1d8 * local_1a8 * local_148.elemsize);
                      pvVar78 = (void *)0x0;
                      do {
                        local_1f8 = pvVar78;
                        if (iVar86 < 1) {
                          iVar71 = 0;
                        }
                        else {
                          uVar88 = 0;
                          iVar71 = 0;
                          pvVar78 = local_1d0;
                          do {
                            if (0 < (int)uVar76) {
                              uVar92 = 0;
                              do {
                                uVar1 = *(ulong *)((long)local_148.data +
                                                  (long)*(int *)((long)local_198.data + uVar92 * 4)
                                                  * 8 + local_148.cstep * local_148.elemsize *
                                                        uVar88 + (long)local_148.w * (long)local_1f0
                                                                 + (long)(iVar83 * 8 *
                                                                         (int)local_1f8));
                                cVar102 = (char)(uVar1 >> 8);
                                cVar103 = (char)(uVar1 >> 0x10);
                                cVar104 = (char)(uVar1 >> 0x18);
                                cVar105 = (char)(uVar1 >> 0x20);
                                cVar106 = (char)(uVar1 >> 0x28);
                                cVar107 = (char)(uVar1 >> 0x30);
                                auVar101._8_6_ = 0;
                                auVar101._0_8_ = uVar1;
                                auVar101[0xe] = (char)(uVar1 >> 0x38);
                                auVar101[0xf] = -((long)uVar1 < 0);
                                auVar100._14_2_ = auVar101._14_2_;
                                auVar100._8_5_ = 0;
                                auVar100._0_8_ = uVar1;
                                auVar100[0xd] = -(cVar107 < '\0');
                                auVar99._13_3_ = auVar100._13_3_;
                                auVar99._8_4_ = 0;
                                auVar99._0_8_ = uVar1;
                                auVar99[0xc] = cVar107;
                                auVar98._12_4_ = auVar99._12_4_;
                                auVar98._8_3_ = 0;
                                auVar98._0_8_ = uVar1;
                                auVar98[0xb] = -(cVar106 < '\0');
                                auVar97._11_5_ = auVar98._11_5_;
                                auVar97._8_2_ = 0;
                                auVar97._0_8_ = uVar1;
                                auVar97[10] = cVar106;
                                auVar96._10_6_ = auVar97._10_6_;
                                auVar96[8] = 0;
                                auVar96._0_8_ = uVar1;
                                auVar96[9] = -(cVar105 < '\0');
                                auVar95._9_7_ = auVar96._9_7_;
                                auVar95[8] = cVar105;
                                auVar95._0_8_ = uVar1;
                                Var44 = CONCAT91(CONCAT81(auVar95._8_8_,-(cVar104 < '\0')),cVar104);
                                auVar59._2_10_ = Var44;
                                auVar59[1] = -(cVar103 < '\0');
                                auVar59[0] = cVar103;
                                auVar58._2_12_ = auVar59;
                                auVar58[1] = -(cVar102 < '\0');
                                auVar58[0] = cVar102;
                                auVar94._0_2_ = CONCAT11(-((char)uVar1 < '\0'),(char)uVar1);
                                auVar94._2_14_ = auVar58;
                                uVar1 = *(ulong *)((long)pvVar78 + uVar92 * 8);
                                cVar102 = (char)(uVar1 >> 8);
                                cVar103 = (char)(uVar1 >> 0x10);
                                cVar104 = (char)(uVar1 >> 0x18);
                                cVar105 = (char)(uVar1 >> 0x20);
                                cVar106 = (char)(uVar1 >> 0x28);
                                cVar107 = (char)(uVar1 >> 0x30);
                                auVar117._8_6_ = 0;
                                auVar117._0_8_ = uVar1;
                                auVar117[0xe] = (char)(uVar1 >> 0x38);
                                auVar117[0xf] = -((long)uVar1 < 0);
                                auVar116._14_2_ = auVar117._14_2_;
                                auVar116._8_5_ = 0;
                                auVar116._0_8_ = uVar1;
                                auVar116[0xd] = -(cVar107 < '\0');
                                auVar115._13_3_ = auVar116._13_3_;
                                auVar115._8_4_ = 0;
                                auVar115._0_8_ = uVar1;
                                auVar115[0xc] = cVar107;
                                auVar114._12_4_ = auVar115._12_4_;
                                auVar114._8_3_ = 0;
                                auVar114._0_8_ = uVar1;
                                auVar114[0xb] = -(cVar106 < '\0');
                                auVar113._11_5_ = auVar114._11_5_;
                                auVar113._8_2_ = 0;
                                auVar113._0_8_ = uVar1;
                                auVar113[10] = cVar106;
                                auVar112._10_6_ = auVar113._10_6_;
                                auVar112[8] = 0;
                                auVar112._0_8_ = uVar1;
                                auVar112[9] = -(cVar105 < '\0');
                                auVar111._9_7_ = auVar112._9_7_;
                                auVar111[8] = cVar105;
                                auVar111._0_8_ = uVar1;
                                Var47 = CONCAT91(CONCAT81(auVar111._8_8_,-(cVar104 < '\0')),cVar104)
                                ;
                                auVar61._2_10_ = Var47;
                                auVar61[1] = -(cVar103 < '\0');
                                auVar61[0] = cVar103;
                                auVar60._2_12_ = auVar61;
                                auVar60[1] = -(cVar102 < '\0');
                                auVar60[0] = cVar102;
                                auVar110._0_2_ = CONCAT11(-((char)uVar1 < '\0'),(char)uVar1);
                                auVar110._2_14_ = auVar60;
                                sVar135 = (short)Var47 * (short)Var44;
                                auVar118 = pmulhw(auVar110,auVar94);
                                iVar67 = CONCAT22(auVar118._6_2_,sVar135);
                                Var44 = CONCAT64(CONCAT42(iVar67,auVar118._4_2_),
                                                 CONCAT22(auVar61._0_2_ * auVar59._0_2_,sVar135));
                                auVar62._4_8_ = (long)((unkuint10)Var44 >> 0x10);
                                auVar62._2_2_ = auVar118._2_2_;
                                auVar62._0_2_ = auVar60._0_2_ * auVar58._0_2_;
                                iVar77 = CONCAT22(auVar118._8_2_,auVar111._8_2_ * auVar95._8_2_);
                                auVar123._0_8_ =
                                     CONCAT26(auVar118._10_2_,
                                              CONCAT24(auVar113._10_2_ * auVar97._10_2_,iVar77));
                                auVar123._8_2_ = auVar115._12_2_ * auVar99._12_2_;
                                auVar123._10_2_ = auVar118._12_2_;
                                auVar133._12_2_ = auVar116._14_2_ * auVar100._14_2_;
                                auVar133._0_12_ = auVar123;
                                auVar133._14_2_ = auVar118._14_2_;
                                iVar71 = iVar71 + auVar133._12_4_ + iVar67 +
                                                  (int)((ulong)auVar123._0_8_ >> 0x20) +
                                                  auVar62._0_4_ +
                                                  auVar123._8_4_ + (int)((unkuint10)Var44 >> 0x10) +
                                                  iVar77 + CONCAT22(auVar118._0_2_,
                                                                    auVar110._0_2_ * auVar94._0_2_);
                                uVar92 = uVar92 + 1;
                              } while (uVar76 != uVar92);
                              pvVar78 = (void *)((long)pvVar78 + (ulong)uVar76 * 8);
                            }
                            uVar88 = uVar88 + 1;
                          } while (uVar88 != uVar81);
                        }
                        *(int *)((long)local_1e8 + (long)local_1f8 * 4) = iVar71;
                        pvVar78 = (void *)((long)local_1f8 + 1U);
                      } while ((long)local_1f8 + 1U != uVar68);
                    }
                    local_1e8 = (void *)((long)local_1e8 + (long)local_1e0 * 4);
                    local_1d8 = (void *)((long)local_1d8 + 1);
                  } while ((undefined1 *)local_1d8 != local_1c0);
                }
                local_1b0 = (Mat *)((long)&local_1b0->data + 1);
              } while (local_1b0 != (Mat *)local_a8);
            }
            if (local_198.data != (void *)0x0) {
              operator_delete(local_198.data,local_198.elemsize - (long)local_198.data);
            }
          }
        }
      }
    }
    iVar86 = local_f8.w;
    iVar71 = local_148.c;
    if (((int)local_1a0 == 1) && ((int)local_b0 == 1)) {
      p_Var40 = local_1c8->_vptr_Convolution_x86[-3];
      uVar82 = *(uint *)(p_Var40 + 0x2c + (long)&(local_1c8->weight_winograd23_data).data);
      pvVar78 = (void *)(ulong)uVar82;
      if (pvVar78 == (void *)0x1) {
        if ((((*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 1) &&
             (*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
           ((*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1)))) {
          conv1x1s1_sgemm_int8_sse(&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
        else {
          if ((((uVar82 != 1) ||
               ((*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) != 1 ||
                (*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) != 1))))
              || (*(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) != 1))
             || ((*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) != 2 ||
                 (*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) != 2)))
             ) goto LAB_001b4de9;
          conv1x1s2_sgemm_int8_sse(&local_148,&local_f8,&local_1c8->weight_sgemm_data,local_1b8);
        }
      }
      else {
LAB_001b4de9:
        if (((local_1b8->use_winograd_convolution == true) &&
            (((uVar82 == 3 && (local_1b8->use_winograd23_convolution != false)) &&
             (*(int *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) == 3)))) &&
           (((((*(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var40 + 0x38 + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data) == 1)) &&
             ((*(int *)(p_Var40 + 0x40 + (long)&(local_1c8->weight_winograd23_data).data) == 1 &&
              (0xf < (int)local_98)))) &&
            (0xf < *(int *)(p_Var40 + 0x28 + (long)&(local_1c8->weight_winograd23_data).data))))) {
          conv3x3s1_winograd23_int8_sse
                    (&local_148,&local_f8,&local_1c8->weight_winograd23_data,local_1b8);
        }
        else {
          local_1d0 = (void *)(ulong)*(uint *)(p_Var40 + 0x30 +
                                              (long)&(local_1c8->weight_winograd23_data).data);
          iVar89 = *(int *)(p_Var40 + 0x34 + (long)&(local_1c8->weight_winograd23_data).data);
          local_1b0 = (Mat *)(long)*(int *)(p_Var40 + 0x38 +
                                           (long)&(local_1c8->weight_winograd23_data).data);
          iVar67 = *(int *)(p_Var40 + 0x3c + (long)&(local_1c8->weight_winograd23_data).data);
          lVar74 = (long)iVar67;
          local_1a8 = (ulong)*(int *)(p_Var40 + 0x40 +
                                     (long)&(local_1c8->weight_winograd23_data).data);
          local_1f0 = (void *)CONCAT44(local_1f0._4_4_,local_148.w);
          uVar81 = (ulong)(uint)local_148.c;
          pvVar91 = (void *)(long)local_f8.w;
          puVar73 = (undefined1 *)(ulong)(uint)local_f8.h;
          uVar76 = *(uint *)(p_Var40 + 0x30 + (long)&(local_1c8->weight_winograd23_data).data) *
                   uVar82;
          local_1c0 = puVar73;
          if (local_1b8->use_sgemm_convolution == true) {
            local_198.cstep = 0;
            local_198.data = (void *)0x0;
            local_198.refcount._0_4_ = 0;
            local_198.refcount._4_4_ = 0;
            local_198.elemsize = 0;
            local_198.elempack = 0;
            local_198.allocator = (Allocator *)0x0;
            local_198.dims = 0;
            local_198.w = 0;
            local_198.h = 0;
            local_198.d = 0;
            local_198.c = 0;
            Mat::create(&local_198,local_f8.h * local_f8.w,uVar76,local_148.c,1,1,
                        local_1b8->workspace_allocator);
            local_1a0 = &local_1c8->weight_sgemm_data;
            if (0 < iVar71) {
              iVar71 = (int)local_1f0 * (int)local_1a8;
              local_1a8 = 0;
              do {
                if (0 < (int)local_1d0) {
                  local_1d8 = (void *)(local_148.cstep * local_1a8 * local_148.elemsize +
                                      (long)local_148.data);
                  puVar85 = (undefined1 *)
                            (local_198.cstep * local_1a8 * local_198.elemsize + (long)local_198.data
                            );
                  local_1e0 = (Mat *)((long)local_148.w * local_148.elemsize * (long)local_1b0);
                  pvVar91 = (void *)0x0;
                  do {
                    local_1f0 = pvVar91;
                    if (0 < (int)uVar82) {
                      local_1f8 = (void *)((long)local_1d8 + (long)local_1e0 * (long)local_1f0);
                      pvVar91 = (void *)0x0;
                      do {
                        if (0 < (int)puVar73) {
                          puVar90 = (undefined1 *)((long)local_1f8 + (long)pvVar91 * (long)iVar89);
                          iVar83 = 0;
                          do {
                            if (iVar86 < 4) {
                              uVar76 = 0;
                            }
                            else {
                              iVar77 = 3;
                              do {
                                *puVar85 = *puVar90;
                                puVar85[1] = puVar90[lVar74];
                                puVar85[2] = puVar90[iVar67 * 2];
                                puVar85[3] = puVar90[iVar67 * 3];
                                puVar90 = puVar90 + lVar74 * 4;
                                puVar85 = puVar85 + 4;
                                iVar77 = iVar77 + 4;
                                uVar76 = iVar86 & 0xfffffffc;
                              } while (iVar77 < iVar86);
                            }
                            uVar87 = uVar76 | 1;
                            while ((int)uVar87 < iVar86) {
                              *puVar85 = *puVar90;
                              puVar85[1] = puVar90[lVar74];
                              puVar90 = puVar90 + iVar67 * 2;
                              puVar85 = puVar85 + 2;
                              uVar87 = uVar76 + 3;
                              uVar76 = uVar76 + 2;
                            }
                            if ((int)uVar76 < iVar86) {
                              iVar77 = iVar86 - uVar76;
                              do {
                                *puVar85 = *puVar90;
                                puVar90 = puVar90 + lVar74;
                                puVar85 = puVar85 + 1;
                                iVar77 = iVar77 + -1;
                              } while (iVar77 != 0);
                            }
                            puVar90 = puVar90 + (iVar71 - iVar86 * iVar67);
                            iVar83 = iVar83 + 1;
                            puVar73 = local_1c0;
                          } while (iVar83 != (int)local_1c0);
                        }
                        pvVar91 = (void *)((long)pvVar91 + 1);
                      } while (pvVar91 != pvVar78);
                    }
                    pvVar91 = (void *)((long)local_1f0 + 1U);
                  } while ((void *)((long)local_1f0 + 1U) != local_1d0);
                }
                local_1a8 = local_1a8 + 1;
                local_1e8 = pvVar78;
              } while (local_1a8 != uVar81);
            }
            im2col_sgemm_int8_sse(&local_198,&local_f8,local_1a0,local_1b8);
            piVar39 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
            if (piVar39 != (int *)0x0) {
              LOCK();
              *piVar39 = *piVar39 + -1;
              UNLOCK();
              if (*piVar39 == 0) {
                if (local_198.allocator == (Allocator *)0x0) {
                  if (local_198.data != (void *)0x0) {
                    free(local_198.data);
                  }
                }
                else {
                  (*(local_198.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_198.cstep = 0;
            local_198.data = (void *)0x0;
            local_198.refcount._0_4_ = 0;
            local_198.refcount._4_4_ = 0;
            local_198.elemsize = 0;
            local_198.elempack = 0;
            local_198.dims = 0;
            local_198.w = 0;
            local_198.h = 0;
            local_198.d = 0;
            local_198.c = 0;
          }
          else {
            local_1a0 = (Mat *)(ulong)(uint)local_f8.c;
            local_1f8 = (void *)(long)(int)uVar76;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_198,(size_type)local_1f8,
                       &local_1f9);
            if (0 < (int)local_1d0) {
              iVar67 = 0;
              iVar83 = 0;
              iVar77 = 0;
              do {
                if (0 < (int)uVar82) {
                  lVar80 = 0;
                  do {
                    *(int *)((long)local_198.data + (iVar67 + lVar80) * 4) = iVar77;
                    iVar77 = iVar77 + iVar89;
                    lVar80 = lVar80 + 1;
                  } while (uVar82 != (uint)lVar80);
                  iVar67 = iVar67 + (uint)lVar80;
                }
                iVar77 = iVar77 + ((int)local_1f0 * (int)local_1b0 - iVar89 * uVar82);
                iVar83 = iVar83 + 1;
              } while (iVar83 != (int)local_1d0);
            }
            if (0 < (int)local_1a0) {
              local_98 = local_f8.data;
              local_b0 = local_f8.elemsize * local_f8.cstep;
              local_a8 = (undefined1 *)CONCAT44(local_a8._4_4_,iVar71 * uVar76);
              local_1b0 = (Mat *)0x0;
              do {
                if (0 < (int)puVar73) {
                  local_208 = (void *)(local_b0 * (long)local_1b0 + (long)local_f8.data);
                  local_1d8 = (void *)((long)(int)(iVar71 * uVar76 * (int)local_1b0) +
                                      (long)(local_1c8->weight_data_tm).data);
                  local_1e0 = (Mat *)0x0;
                  do {
                    if (0 < iVar86) {
                      local_1f0 = local_148.data;
                      local_1d0 = (void *)((long)local_1e0 * local_1a8 * local_148.elemsize);
                      pvVar78 = (void *)0x0;
                      do {
                        local_1e8 = pvVar78;
                        if (iVar71 < 1) {
                          iVar89 = 0;
                        }
                        else {
                          uVar68 = 0;
                          iVar89 = 0;
                          pvVar78 = local_1d8;
                          do {
                            if (0 < (int)uVar76) {
                              uVar88 = 0;
                              do {
                                iVar89 = iVar89 + (int)*(char *)((long)pvVar78 + uVar88) *
                                                  (int)*(char *)((long)local_148.data +
                                                                (long)*(int *)((long)local_198.data
                                                                              + uVar88 * 4) +
                                                                local_148.cstep * local_148.elemsize
                                                                * uVar68 +
                                                                (long)local_148.w * (long)local_1d0
                                                                + (long)local_1e8 * lVar74);
                                uVar88 = uVar88 + 1;
                              } while (uVar76 != uVar88);
                            }
                            pvVar78 = (void *)((long)local_1f8 + (long)pvVar78);
                            uVar68 = uVar68 + 1;
                          } while (uVar68 != uVar81);
                        }
                        *(int *)((long)local_208 + (long)local_1e8 * 4) = iVar89;
                        pvVar78 = (void *)((long)local_1e8 + 1U);
                      } while ((void *)((long)local_1e8 + 1U) != pvVar91);
                    }
                    local_208 = (void *)((long)local_208 + (long)pvVar91 * 4);
                    local_1e0 = (Mat *)((long)&local_1e0->data + 1);
                    puVar73 = local_1c0;
                  } while (local_1e0 != (Mat *)local_1c0);
                }
                local_1b0 = (Mat *)((long)&local_1b0->data + 1);
              } while (local_1b0 != local_1a0);
            }
            if (local_198.data != (void *)0x0) {
              operator_delete(local_198.data,local_198.elemsize - (long)local_198.data);
            }
          }
        }
      }
    }
    p_Var40 = local_1c8->_vptr_Convolution_x86[-3];
    if (local_8c < 0x65) {
      dequantize_from_int32
                (&local_f8,local_a0,&local_1c8->scale_in_data,
                 (Mat *)(p_Var40 + 0x18 + (long)&(local_1c8->scale_in_data).data),local_1b8);
      pLVar41 = local_1c8->activation;
      iVar71 = 0;
      if (pLVar41 != (Layer *)0x0) {
        (*pLVar41->_vptr_Layer[9])(pLVar41,local_a0,local_1b8);
      }
    }
    else {
      iVar71 = 0;
      requantize_from_int32_to_int8
                (&local_f8,local_a0,&local_1c8->scale_in_data,
                 (Mat *)(&local_1c8->field_0x280 + (long)p_Var40),
                 (Mat *)(p_Var40 + 0x18 + (long)&(local_1c8->scale_in_data).data),
                 *(int *)(p_Var40 + 0x1c + (long)&(local_1c8->weight_winograd43_data).data),
                 (Mat *)(p_Var40 + 0x20 + (long)&(local_1c8->weight_winograd43_data).data),local_1b8
                );
    }
  }
  piVar39 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar39 != (int *)0x0) {
    LOCK();
    *piVar39 = *piVar39 + -1;
    UNLOCK();
    if (*piVar39 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize = 0;
  local_f8.elempack = 0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
LAB_001b550f:
  piVar39 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar39 != (int *)0x0) {
    LOCK();
    *piVar39 = *piVar39 + -1;
    UNLOCK();
    if (*piVar39 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize = 0;
  local_148.elempack = 0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  piVar39 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
  if (piVar39 != (int *)0x0) {
    LOCK();
    *piVar39 = *piVar39 + -1;
    UNLOCK();
    if (*piVar39 == 0) {
      if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
        if ((void *)local_88._0_8_ != (void *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_88._32_8_)[3])();
      }
    }
  }
  return iVar71;
}

Assistant:

int Convolution_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 1 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv7x7s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 8 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, opt);
            // conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}